

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O2

void send_custom_headers(TadsServerThread *t,vm_val_t *headers)

{
  int iVar1;
  ushort *puVar2;
  ssize_t sVar3;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  int iVar4;
  vm_val_t ele;
  
  iVar1 = vm_val_t::ll_length(headers);
  iVar4 = 0;
  if (0 < iVar1) {
    iVar4 = iVar1;
  }
  iVar1 = 1;
  do {
    if (iVar1 - iVar4 == 1) {
      return;
    }
    vm_val_t::ll_index(headers,&ele,iVar1);
    puVar2 = (ushort *)vm_val_t::get_as_string(&ele);
    if (puVar2 == (ushort *)0x0) {
      err_throw(0x7e3);
    }
    sVar3 = TadsServerThread::send(t,(int)puVar2 + 2,(void *)(ulong)*puVar2,in_RCX,in_R8D);
    if ((int)sVar3 == 0) {
LAB_00207158:
      throw_net_err("HTTPRequest: error sending headers",(t->socket->super_OS_CoreSocket).err);
    }
    else {
      sVar3 = TadsServerThread::send(t,0x2b4d59,__buf,in_RCX,in_R8D);
      if ((int)sVar3 == 0) goto LAB_00207158;
    }
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

static void send_custom_headers(VMG_ TadsServerThread *t,
                                const vm_val_t *headers)
{
    /* send each header */
    int cnt = headers->ll_length(vmg0_);
    for (int i = 1 ; i <= cnt ; ++i)
    {
        /* get this list element */
        vm_val_t ele;
        headers->ll_index(vmg_ &ele, i);

        /* it has to be a string */
        const char *h = ele.get_as_string(vmg0_);
        if (h == 0)
            err_throw(VMERR_STRING_VAL_REQD);

        /* send the header string and the CR-LF */
        if (!t->send(h + VMB_LEN, vmb_get_len(h)) || !t->send("\r\n"))
            throw_net_err(vmg_ "HTTPRequest: error sending headers",
                          t->last_error());
    }
}